

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

Gia_Man_t * Gia_ManFlipUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  p_00 = Gia_ManStart(p->nObjs << 2);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar7 = 0;
  while ((iVar7 < p->vCis->nSize && (pGVar5 = Gia_ManCi(p,iVar7), pGVar5 != (Gia_Obj_t *)0x0))) {
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar1;
    iVar7 = iVar7 + 1;
  }
  iVar8 = 0;
  iVar7 = 0;
  while ((iVar8 < p->nObjs && (pGVar5 = Gia_ManObj(p,iVar8), pGVar5 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      pGVar5->Value = uVar1;
      iVar9 = iVar7 + 1;
      iVar2 = Vec_IntEntry(vMap,iVar7);
      iVar3 = Gia_ManAppendCi(p_00);
      iVar7 = iVar9;
      if (iVar2 != 0) {
        uVar1 = Gia_ManHashXor(p_00,iVar3,pGVar5->Value);
        pGVar5->Value = uVar1;
      }
    }
    iVar8 = iVar8 + 1;
  }
  if (iVar7 == vMap->nSize) {
    iVar7 = 0;
    while ((iVar7 < p->vCos->nSize && (pGVar5 = Gia_ManCo(p,iVar7), pGVar5 != (Gia_Obj_t *)0x0))) {
      iVar8 = Gia_ObjFanin0Copy(pGVar5);
      uVar1 = Gia_ManAppendCo(p_00,iVar8);
      pGVar5->Value = uVar1;
      iVar7 = iVar7 + 1;
    }
    pGVar6 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    iVar7 = pGVar6->vCis->nSize;
    iVar8 = pGVar6->nRegs;
    iVar2 = p->vCis->nSize;
    iVar3 = Gia_ManAndNum(p);
    if (iVar7 - iVar8 != iVar3 + iVar2) {
      __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + Gia_ManAndNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                    ,0x205,"Gia_Man_t *Gia_ManFlipUnfold(Gia_Man_t *, Vec_Int_t *)");
    }
    return pGVar6;
  }
  __assert_fail("iFuncVars == Vec_IntSize(vMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                ,0x200,"Gia_Man_t *Gia_ManFlipUnfold(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManFlipUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iFuncVars = 0;
    pNew = Gia_ManStart( 4 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Vec_IntEntry(vMap, iFuncVars++) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ManAppendCi(pNew), pObj->Value );
        else
            Gia_ManAppendCi(pNew);
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + Gia_ManAndNum(p) );
    return pNew;
}